

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate2<std::complex<float>_>::QRotationGate2
          (QRotationGate2<std::complex<float>_> *this,int *qubits,real_type theta,bool fixed)

{
  float fVar1;
  
  (this->super_QAdjustable).fixed_ = fixed;
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cfc98;
  fVar1 = cosf(theta * 0.5);
  (this->rotation_).angle_.cos_ = fVar1;
  fVar1 = sinf(theta * 0.5);
  (this->rotation_).angle_.sin_ = fVar1;
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[6])
            (this,qubits);
  return;
}

Assistant:

QRotationGate2( const int* qubits , const real_type theta ,
                        const bool fixed = false )
        : rotation_( theta )
        , QAdjustable( fixed )
        {
          setQubits( qubits ) ;
        }